

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Gia_Man_t * Gia_ManDupNoMuxes(Gia_Man_t *p,int fSkipBufs)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iData0;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  uint local_44;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fSkipBufs_local;
  Gia_Man_t *p_local;
  
  if ((p->pMuxes == (uint *)0x0) && (iVar1 = Gia_ManXorNum(p), iVar1 == 0)) {
    __assert_fail("p->pMuxes != NULL || Gia_ManXorNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xa6,"Gia_Man_t *Gia_ManDupNoMuxes(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(5000);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  Gia_ManHashStart(p_00);
  local_34 = 1;
  while( true ) {
    bVar7 = false;
    if (local_34 < p->nObjs) {
      pGStack_30 = Gia_ManObj(p,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsCi(pGStack_30);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_30);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsBuf(pGStack_30);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsMuxId(p,local_34);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsXor(pGStack_30);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjFanin0Copy(pGStack_30);
              iVar3 = Gia_ObjFanin1Copy(pGStack_30);
              uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
              pGStack_30->Value = uVar2;
            }
            else {
              iVar1 = Gia_ObjFanin0Copy(pGStack_30);
              iVar3 = Gia_ObjFanin1Copy(pGStack_30);
              uVar2 = Gia_ManHashXor(p_00,iVar1,iVar3);
              pGStack_30->Value = uVar2;
            }
          }
          else {
            iVar1 = Gia_ObjFanin2Copy(p,pGStack_30);
            iVar3 = Gia_ObjFanin1Copy(pGStack_30);
            iData0 = Gia_ObjFanin0Copy(pGStack_30);
            uVar2 = Gia_ManHashMux(p_00,iVar1,iVar3,iData0);
            pGStack_30->Value = uVar2;
          }
        }
        else {
          if (fSkipBufs == 0) {
            iVar1 = Gia_ObjFanin0Copy(pGStack_30);
            local_44 = Gia_ManAppendBuf(p_00,iVar1);
          }
          else {
            local_44 = Gia_ObjFanin0Copy(pGStack_30);
          }
          pGStack_30->Value = local_44;
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pGStack_30);
        uVar2 = Gia_ManAppendCo(p_00,iVar1);
        pGStack_30->Value = uVar2;
      }
    }
    else {
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_30->Value = uVar2;
    }
    local_34 = local_34 + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupNoMuxes( Gia_Man_t * p, int fSkipBufs )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pMuxes != NULL || Gia_ManXorNum(p) );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = fSkipBufs ? Gia_ObjFanin0Copy(pObj) : Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}